

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite_inl.h
# Opt level: O3

bool google::protobuf::internal::WireFormatLite::ReadMessage
               (CodedInputStream *input,MessageLite *value)

{
  uint8 *puVar1;
  bool bVar2;
  pair<int,_int> pVar3;
  int iVar4;
  
  puVar1 = input->buffer_;
  if ((puVar1 < input->buffer_end_) && (iVar4 = (int)(char)*puVar1, -1 < (char)*puVar1)) {
    input->buffer_ = puVar1 + 1;
  }
  else {
    iVar4 = io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
    if (iVar4 < 0) {
      return false;
    }
  }
  pVar3 = io::CodedInputStream::IncrementRecursionDepthAndPushLimit(input,iVar4);
  if ((-1 < (long)pVar3) &&
     (iVar4 = (*value->_vptr_MessageLite[0xb])(value,input), (char)iVar4 != '\0')) {
    bVar2 = io::CodedInputStream::DecrementRecursionDepthAndPopLimit(input,pVar3.first);
    return bVar2;
  }
  return false;
}

Assistant:

inline bool WireFormatLite::ReadMessage(io::CodedInputStream* input,
                                        MessageLite* value) {
  int length;
  if (!input->ReadVarintSizeAsInt(&length)) return false;
  std::pair<io::CodedInputStream::Limit, int> p =
      input->IncrementRecursionDepthAndPushLimit(length);
  if (p.second < 0 || !value->MergePartialFromCodedStream(input)) return false;
  // Make sure that parsing stopped when the limit was hit, not at an endgroup
  // tag.
 return input->DecrementRecursionDepthAndPopLimit(p.first);
}